

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall
dg::pta::PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,dg::Offset&>
          (PointerGraph *this,PSNode **args,Offset *args_1)

{
  type pPVar1;
  PSNode **in_RDX;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *in_RSI;
  PSNode **in_RDI;
  PointerGraph *unaff_retaddr;
  PSNode *n;
  
  pPVar1 = nodeFactory<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,dg::Offset&,dg::pta::PSNodeConstant>
                     (unaff_retaddr,in_RDI,(Offset *)in_RSI);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>(in_RSI,in_RDX);
  return &pPVar1->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }